

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsSecondDeriv
          (BeagleCPUImpl<float,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int firstDerivativeIndex,int secondDerivativeIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood,
          double *outSumFirstDerivative,double *outSumSecondDerivative)

{
  uint uVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int in_stack_00000008;
  int i_3;
  int k_3;
  float *scalingFactors;
  double *in_stack_00000020;
  int i_2;
  float sumOverID2;
  float sumOverID1;
  float sumOverI;
  int k_2;
  int u;
  int j;
  double sumOverJD2;
  double sumOverJD1;
  double sumOverJ;
  int i_1;
  int w_1;
  int k_1;
  float weight_1;
  int u_2;
  int l_1;
  int v_1;
  float *partialsChild;
  int i;
  int w;
  int stateChild;
  int k;
  float weight;
  int u_1;
  int l;
  int v;
  int *statesChild;
  float *freqs;
  float *wt;
  float *secondDerivMatrix;
  float *firstDerivMatrix;
  float *transMatrix;
  float *partialsParent;
  int returnCode;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_6c;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_20;
  
  local_20 = 0;
  lVar4 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 8);
  lVar5 = *(long *)(*(long *)(in_RDI + 0xd0) + (long)in_ECX * 8);
  lVar6 = *(long *)(*(long *)(in_RDI + 0xd0) + (long)in_R8D * 8);
  lVar7 = *(long *)(*(long *)(in_RDI + 0xd0) + (long)in_R9D * 8);
  lVar8 = *(long *)(*(long *)(in_RDI + 0x98) + (long)in_stack_00000008 * 8);
  lVar9 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)i_3 * 8);
  memset(*(void **)(in_RDI + 0xd8),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 2)
  ;
  memset(*(void **)(in_RDI + 0xe0),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 2)
  ;
  memset(*(void **)(in_RDI + 0xe8),0,(long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 2)
  ;
  if ((in_EDX < *(int *)(in_RDI + 0x10)) &&
     (*(long *)(*(long *)(in_RDI + 0xb0) + (long)in_EDX * 8) != 0)) {
    lVar10 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)in_EDX * 8);
    local_5c = 0;
    for (local_60 = 0; local_60 < *(int *)(in_RDI + 0x34); local_60 = local_60 + 1) {
      local_64 = 0;
      uVar1 = *(uint *)(lVar8 + (long)local_60 * 4);
      for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x14); local_6c = local_6c + 1) {
        iVar3 = *(int *)(lVar10 + (long)local_6c * 4);
        local_74 = local_60 * *(int *)(in_RDI + 0x40);
        for (local_78 = 0; local_78 < *(int *)(in_RDI + 0x24); local_78 = local_78 + 1) {
          auVar13 = vfmadd213ss_fma(ZEXT416(uVar1),
                                    ZEXT416((uint)(*(float *)(lVar5 + (long)(local_74 + iVar3) * 4)
                                                  * *(float *)(lVar4 + (long)(local_5c + local_78) *
                                                                       4))),
                                    ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_64 * 4)
                                           ));
          *(int *)(*(long *)(in_RDI + 0xd8) + (long)local_64 * 4) = auVar13._0_4_;
          auVar13 = vfmadd213ss_fma(ZEXT416(uVar1),
                                    ZEXT416((uint)(*(float *)(lVar6 + (long)(local_74 + iVar3) * 4)
                                                  * *(float *)(lVar4 + (long)(local_5c + local_78) *
                                                                       4))),
                                    ZEXT416(*(uint *)(*(long *)(in_RDI + 0xe0) + (long)local_64 * 4)
                                           ));
          *(int *)(*(long *)(in_RDI + 0xe0) + (long)local_64 * 4) = auVar13._0_4_;
          auVar13 = vfmadd213ss_fma(ZEXT416(uVar1),
                                    ZEXT416((uint)(*(float *)(lVar7 + (long)(local_74 + iVar3) * 4)
                                                  * *(float *)(lVar4 + (long)(local_5c + local_78) *
                                                                       4))),
                                    ZEXT416(*(uint *)(*(long *)(in_RDI + 0xe8) + (long)local_64 * 4)
                                           ));
          *(int *)(*(long *)(in_RDI + 0xe8) + (long)local_64 * 4) = auVar13._0_4_;
          local_64 = local_64 + 1;
          local_74 = *(int *)(in_RDI + 0x28) + local_74;
        }
        local_5c = *(int *)(in_RDI + 0x2c) + local_5c;
      }
    }
  }
  else {
    lVar10 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)in_EDX * 8);
    local_84 = 0;
    for (local_88 = 0; local_88 < *(int *)(in_RDI + 0x34); local_88 = local_88 + 1) {
      local_8c = 0;
      fVar2 = *(float *)(lVar8 + (long)local_88 * 4);
      for (local_94 = 0; local_94 < *(int *)(in_RDI + 0x14); local_94 = local_94 + 1) {
        local_98 = local_88 * *(int *)(in_RDI + 0x40);
        for (local_9c = 0; local_9c < *(int *)(in_RDI + 0x24); local_9c = local_9c + 1) {
          local_a8 = 0.0;
          local_b0 = 0.0;
          local_b8 = 0.0;
          for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x24); local_bc = local_bc + 1) {
            local_a8 = (double)(*(float *)(lVar5 + (long)local_98 * 4) *
                               *(float *)(lVar10 + (long)(local_84 + local_bc) * 4)) + local_a8;
            local_b0 = (double)(*(float *)(lVar6 + (long)local_98 * 4) *
                               *(float *)(lVar10 + (long)(local_84 + local_bc) * 4)) + local_b0;
            fVar11 = *(float *)(lVar7 + (long)local_98 * 4) *
                     *(float *)(lVar10 + (long)(local_84 + local_bc) * 4);
            in_ZMM1 = ZEXT464((uint)fVar11);
            local_b8 = (double)fVar11 + local_b8;
            local_98 = local_98 + 1;
          }
          local_98 = local_98 + 1;
          auVar20._8_8_ = in_ZMM1._8_8_;
          auVar20._0_8_ = (double)fVar2;
          auVar26._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0xd8) + (long)local_8c * 4);
          auVar26._8_8_ = 0;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_a8 * (double)*(float *)(lVar4 + (long)(local_84 + local_9c) * 4);
          auVar13 = vfmadd213sd_fma(auVar20,auVar13,auVar26);
          *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_8c * 4) = (float)auVar13._0_8_;
          auVar21._0_8_ = (double)fVar2;
          auVar21._8_8_ = auVar13._8_8_;
          auVar27._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0xe0) + (long)local_8c * 4);
          auVar27._8_8_ = 0;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_b0 * (double)*(float *)(lVar4 + (long)(local_84 + local_9c) * 4);
          auVar13 = vfmadd213sd_fma(auVar21,auVar14,auVar27);
          *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_8c * 4) = (float)auVar13._0_8_;
          auVar22._0_8_ = (double)fVar2;
          auVar22._8_8_ = auVar13._8_8_;
          auVar28._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0xe8) + (long)local_8c * 4);
          auVar28._8_8_ = 0;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_b8 * (double)*(float *)(lVar4 + (long)(local_84 + local_9c) * 4);
          auVar13 = vfmadd213sd_fma(auVar22,auVar15,auVar28);
          in_ZMM1 = ZEXT1664(auVar13);
          *(float *)(*(long *)(in_RDI + 0xe8) + (long)local_8c * 4) = (float)auVar13._0_8_;
          local_8c = local_8c + 1;
        }
        local_84 = *(int *)(in_RDI + 0x2c) + local_84;
      }
    }
  }
  local_c0 = 0;
  for (local_c4 = 0; local_c4 < *(int *)(in_RDI + 0x14); local_c4 = local_c4 + 1) {
    local_c8 = 0.0;
    local_cc = 0.0;
    local_d0 = 0.0;
    for (local_d4 = 0; local_d4 < *(int *)(in_RDI + 0x24); local_d4 = local_d4 + 1) {
      auVar13 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0xd8) + (long)local_c0 * 4)),
                                ZEXT416(*(uint *)(lVar9 + (long)local_d4 * 4)),
                                ZEXT416((uint)local_c8));
      local_c8 = auVar13._0_4_;
      auVar13 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0xe0) + (long)local_c0 * 4)),
                                ZEXT416(*(uint *)(lVar9 + (long)local_d4 * 4)),
                                ZEXT416((uint)local_cc));
      local_cc = auVar13._0_4_;
      auVar13 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0xe8) + (long)local_c0 * 4)),
                                ZEXT416(*(uint *)(lVar9 + (long)local_d4 * 4)),
                                ZEXT416((uint)local_d0));
      local_d0 = auVar13._0_4_;
      local_c0 = local_c0 + 1;
    }
    dVar12 = log((double)local_c8);
    *(float *)(*(long *)(in_RDI + 0x108) + (long)local_c4 * 4) = (float)dVar12;
    *(float *)(*(long *)(in_RDI + 0x110) + (long)local_c4 * 4) = local_cc / local_c8;
    auVar13 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x110) + (long)local_c4 * 4)),
                              ZEXT416(*(uint *)(*(long *)(in_RDI + 0x110) + (long)local_c4 * 4) ^
                                      0x80000000),ZEXT416((uint)(local_d0 / local_c8)));
    *(int *)(*(long *)(in_RDI + 0x118) + (long)local_c4 * 4) = auVar13._0_4_;
  }
  if ((int)scalingFactors != -1) {
    lVar4 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)(int)scalingFactors * 8);
    for (local_e4 = 0; local_e4 < *(int *)(in_RDI + 0x14); local_e4 = local_e4 + 1) {
      *(float *)(*(long *)(in_RDI + 0x108) + (long)local_e4 * 4) =
           *(float *)(lVar4 + (long)local_e4 * 4) +
           *(float *)(*(long *)(in_RDI + 0x108) + (long)local_e4 * 4);
    }
  }
  *in_stack_00000020 = 0.0;
  *_sumOverID2 = 0;
  auVar19 = ZEXT1664((undefined1  [16])0x0);
  *_sumOverI = 0;
  for (local_e8 = 0; local_e8 < *(int *)(in_RDI + 0x14); local_e8 = local_e8 + 1) {
    auVar23._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x108) + (long)local_e8 * 4);
    auVar23._8_8_ = auVar19._8_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_e8 * 8);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *in_stack_00000020;
    auVar13 = vfmadd213sd_fma(auVar16,auVar23,auVar29);
    *in_stack_00000020 = auVar13._0_8_;
    auVar24._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x110) + (long)local_e8 * 4);
    auVar24._8_8_ = auVar13._8_8_;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_e8 * 8);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *_sumOverID2;
    auVar13 = vfmadd213sd_fma(auVar17,auVar24,auVar30);
    *_sumOverID2 = auVar13._0_8_;
    auVar25._0_8_ = (double)*(float *)(*(long *)(in_RDI + 0x118) + (long)local_e8 * 4);
    auVar25._8_8_ = auVar13._8_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x78) + (long)local_e8 * 8);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *_sumOverI;
    auVar13 = vfmadd213sd_fma(auVar18,auVar25,auVar31);
    auVar19 = ZEXT1664(auVar13);
    *_sumOverI = auVar13._0_8_;
  }
  if ((*in_stack_00000020 != *in_stack_00000020) ||
     (NAN(*in_stack_00000020) || NAN(*in_stack_00000020))) {
    local_20 = -8;
  }
  return local_20;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDeriv(const int parIndex,
                                                                         const int childIndex,
                                                                         const int probIndex,
                                                                         const int firstDerivativeIndex,
                                                                         const int secondDerivativeIndex,
                                                                         const int categoryWeightsIndex,
                                                                         const int stateFrequenciesIndex,
                                                                         const int scalingFactorsIndex,
                                                                         double* outSumLogLikelihood,
                                                                         double* outSumFirstDerivative,
                                                                         double* outSumSecondDerivative) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
    const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];


    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(firstDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));
    memset(secondDerivTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJ = 0.0;
                    double sumOverJD1 = 0.0;
                    double sumOverJD2 = 0.0;
                    for(int j = 0; j < kStateCount; j++) {
                        sumOverJ += transMatrix[w] * partialsChild[v + j];
                        sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                        sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                        w++;
                    }

                    // increment for the extra column at the end
                    w += T_PAD;

                    integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                    firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                    secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                    u++;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        REALTYPE sumOverID1 = 0.0;
        REALTYPE sumOverID2 = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            sumOverID1 += freqs[i] * firstDerivTmp[u];
            sumOverID2 += freqs[i] * secondDerivTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
        outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
        outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    *outSumFirstDerivative = 0.0;
    *outSumSecondDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];

        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];

        *outSumSecondDerivative += outSecondDerivativesTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}